

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O2

optional<unsigned_long> __thiscall
cappuccino::lru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::find
          (lru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,
          unsigned_long *key,peek peek)

{
  undefined1 auVar1 [12];
  optional<unsigned_long> oVar2;
  
  std::mutex::lock((mutex *)this);
  oVar2 = do_find(this,key,peek);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  auVar1 = oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._0_12_;
  oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 0;
  oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)auVar1._0_8_;
  oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)auVar1[8];
  oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_3_ = auVar1._9_3_;
  return (optional<unsigned_long>)
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

auto find(const key_type& key, peek peek = peek::no) -> std::optional<value_type>
    {
        std::lock_guard guard{m_lock};
        return do_find(key, peek);
    }